

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional3::getExpectedVerticesSubmittedQueryResult
          (PipelineStatisticsQueryTestFunctional3 *this,_primitive_type current_primitive_type,
          uint *out_results_written,GLuint64 *out_results)

{
  bool bVar1;
  uint uVar2;
  _draw_call_type _Var3;
  uint uVar4;
  ulong uVar5;
  TestError *this_00;
  long lVar6;
  long lVar7;
  
  uVar2 = (this->super_PipelineStatisticsQueryTestFunctionalBase).
          m_indirect_draw_call_count_argument;
  *out_results_written = 0;
  if (PRIMITIVE_TYPE_TRIANGLES_ADJACENCY < current_primitive_type) {
switchD_00a3f522_caseD_5:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized primitive type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
               ,0xd82);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  bVar1 = this->m_is_primitive_restart_enabled;
  uVar4 = uVar2 - bVar1;
  switch(current_primitive_type) {
  default:
    *out_results_written = 1;
    *out_results = (ulong)uVar4;
    lVar7 = 1;
    goto LAB_00a3f615;
  case PRIMITIVE_TYPE_LINE_LOOP:
    *out_results = (ulong)uVar4;
    uVar5 = (ulong)(uVar4 + 1);
    break;
  case PRIMITIVE_TYPE_LINES:
    *out_results_written = 1;
    *out_results = (ulong)uVar4;
    lVar7 = 1;
    if ((uVar4 & 1) == 0) goto LAB_00a3f615;
    uVar5 = (ulong)(uVar4 - 1);
    break;
  case PRIMITIVE_TYPE_LINES_ADJACENCY:
    *out_results = (ulong)uVar4;
    *out_results_written = 2;
    out_results[1] = (ulong)(uVar4 >> 1);
    if ((uVar4 & 3) != 0) {
      uVar4 = uVar4 & 0xfffffffc;
      goto LAB_00a3f59b;
    }
    goto LAB_00a3f610;
  case PRIMITIVE_TYPE_PATCHES:
    goto switchD_00a3f522_caseD_5;
  case PRIMITIVE_TYPE_TRIANGLES:
    *out_results_written = 1;
    *out_results = (ulong)uVar4;
    lVar7 = 1;
    if ((uVar2 == bVar1) || (uVar4 % 3 == 0)) goto LAB_00a3f615;
    uVar5 = (ulong)(uVar4 - uVar4 % 3);
    break;
  case PRIMITIVE_TYPE_TRIANGLES_ADJACENCY:
    *out_results = (ulong)uVar4;
    *out_results_written = 2;
    out_results[1] = (ulong)(uVar4 >> 1);
    lVar7 = 2;
    if ((uVar2 == bVar1) || (uVar4 % 6 == 0)) goto LAB_00a3f615;
    uVar4 = uVar4 - uVar4 % 6;
LAB_00a3f59b:
    out_results[2] = (ulong)uVar4;
    *out_results_written = 4;
    out_results[3] = (ulong)(uVar4 >> 1);
    lVar7 = 4;
    goto LAB_00a3f615;
  }
  *out_results_written = 2;
  out_results[1] = uVar5;
LAB_00a3f610:
  lVar7 = 2;
LAB_00a3f615:
  _Var3 = (this->super_PipelineStatisticsQueryTestFunctionalBase).m_current_draw_call_type;
  if ((_Var3 < DRAW_CALL_TYPE_GLDRAWRANGEELEMENTS) && ((0x3ceU >> (_Var3 & 0x1f) & 1) != 0)) {
    uVar2 = (this->super_PipelineStatisticsQueryTestFunctionalBase).
            m_indirect_draw_call_primcount_argument;
    lVar6 = 0;
    do {
      out_results[lVar6] = out_results[lVar6] * (ulong)uVar2;
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  return;
}

Assistant:

void PipelineStatisticsQueryTestFunctional3::getExpectedVerticesSubmittedQueryResult(
	PipelineStatisticsQueryUtilities::_primitive_type current_primitive_type, unsigned int* out_results_written,
	glw::GLuint64 out_results[4])
{
	unsigned int n_input_vertices = m_indirect_draw_call_count_argument;

	*out_results_written = 0;

	/* Sanity checks */
	DE_ASSERT(current_primitive_type != PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_PATCHES);

	/* Carry on */
	if (m_is_primitive_restart_enabled)
	{
		/* Primitive restart functionality in our test removes a single index.
		 *
		 * Note: This also applies to arrayed draw calls, since we're testing
		 *       GL_PRIMITIVE_RESTART rendering mode, and we're using a primitive
		 *       restart index of 0.
		 **/
		n_input_vertices--;
	}

	switch (current_primitive_type)
	{
	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_POINTS:
	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINE_STRIP:
	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLE_FAN:
	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLE_STRIP:
	{
		out_results[(*out_results_written)++] = n_input_vertices;

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINE_LOOP:
	{
		out_results[(*out_results_written)++] = n_input_vertices;

		/* Allow line loops to count the first vertex twice as that vertex
		 * is part of both the first and the last primitives.
		 */
		out_results[(*out_results_written)++] = n_input_vertices + 1;
		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINES:
	{
		out_results[(*out_results_written)++] = n_input_vertices;

		/* If the submitted line is incomplete, also include the case where
		 * the incomplete line's vertices are not counted.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 2) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices - 1;
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_LINES_ADJACENCY:
	{
		/* Allow implementations to both include or exclude the adjacency
		 * vertices.
		 */
		out_results[(*out_results_written)++] = n_input_vertices;
		out_results[(*out_results_written)++] = n_input_vertices / 2;

		/* If the submitted line is incomplete, also include the case where
		 * the incomplete line's vertices are not counted.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 4) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices - (n_input_vertices % 4);
			out_results[(*out_results_written)++] = (n_input_vertices - (n_input_vertices % 4)) / 2;
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLES:
	{
		out_results[(*out_results_written)++] = n_input_vertices;

		/* If the submitted triangle is incomplete, also include the case
		 * when the incomplete triangle's vertices are not counted.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 3) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices - (n_input_vertices % 3);
		}

		break;
	}

	case PipelineStatisticsQueryUtilities::PRIMITIVE_TYPE_TRIANGLES_ADJACENCY:
	{
		/* Allow implementations to both include or exclude the adjacency
		 * vertices.
		 */
		out_results[(*out_results_written)++] = n_input_vertices;
		out_results[(*out_results_written)++] = n_input_vertices / 2;

		/* If the submitted triangle is incomplete, also include the case
		 * when the incomplete triangle's vertices are not counted.
		 */
		if (n_input_vertices > 0 && (n_input_vertices % 6) != 0)
		{
			out_results[(*out_results_written)++] = n_input_vertices - (n_input_vertices % 6);
			out_results[(*out_results_written)++] = (n_input_vertices - (n_input_vertices % 6)) / 2;
		}

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized primitive type");
	}
	} /* switch (current_primitive_type) */

	if (PipelineStatisticsQueryUtilities::isInstancedDrawCall(m_current_draw_call_type))
	{
		for (unsigned int i = 0; i < *out_results_written; ++i)
		{
			out_results[i] *= m_indirect_draw_call_primcount_argument;
		}
	} /* if (instanced draw call type) */
}